

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

Test * GraphTestDepfileOverride::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestDepfileOverride((GraphTestDepfileOverride *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, DepfileOverride) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule r\n"
"  depfile = x\n"
"  command = unused\n"
"build out: r in\n"
"  depfile = y\n"));
  Edge* edge = GetNode("out")->in_edge();
  EXPECT_EQ("y", edge->GetBinding("depfile"));
}